

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnightBoard.cpp
# Opt level: O1

void __thiscall KnightBoard::printBoard(KnightBoard *this)

{
  undefined8 in_RAX;
  Square *pSVar1;
  long lVar2;
  uint row;
  char *pcVar3;
  ostream *poVar4;
  uint col;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (this->size != 0) {
    row = 0;
    do {
      if (this->size != 0) {
        col = 0;
        do {
          pSVar1 = getSquare(this,row,col);
          if (pSVar1->containsKnight == true) {
            lVar2 = 2;
            poVar4 = (ostream *)&std::cout;
            pcVar3 = "K ";
          }
          else {
            pSVar1 = getSquare(this,row,col);
            uStack_38 = CONCAT17(pSVar1->symbol,(undefined7)uStack_38);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
            lVar2 = 1;
            pcVar3 = " ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar2);
          col = col + 1;
        } while (col < this->size);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      row = row + 1;
    } while (row < this->size);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  return;
}

Assistant:

void KnightBoard::printBoard() {
    for (unsigned int i = 0; i < size; i++) {
        for (unsigned int j = 0; j < size; j++) {
            if(this->getSquare(i,j)->containsKnight)
                cout<<"K ";
            else
                cout << this->getSquare(i, j)->symbol<<" ";
        }
        cout << endl;
    }
    cout << endl;
}